

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

Vertex * __thiscall Graph::findVertex(Graph *this,int id)

{
  Vertex *pVVar1;
  
  pVVar1 = this->verticesList;
  while( true ) {
    if (pVVar1 == (Vertex *)0x0) {
      return (Vertex *)0x0;
    }
    if (pVVar1->id == id) break;
    pVVar1 = pVVar1->nextVertex;
  }
  return pVVar1;
}

Assistant:

Vertex *Graph::findVertex(int id){

    Vertex *v = verticesList;
    while(v!=NULL){
        if(v->getID() == id)
            return v;
        v = v->getNext();
    }
    return NULL;

}